

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest12::getTestCaseString_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest12 *this,_test_case *test_case)

{
  allocator<char> local_22;
  undefined1 local_21;
  _test_case *local_20;
  _test_case *test_case_local;
  NegativeTest12 *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (NegativeTest12 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  switch(*local_20) {
  case TEST_CASE_FIRST:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE");
    break;
  case TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE");
    break;
  case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR");
    break;
  case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT")
    ;
    break;
  case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest12::getTestCaseString(const _test_case& test_case)
{
	std::string result = "?";

	switch (test_case)
	{
	case TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE:
		result = "TEST_CASE_INVALID_LOCAL_SUBROUTINE_VARIABLE";
		break;
	case TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE:
		result = "TEST_CASE_INVALID_GLOBAL_SUBROUTINE_VARIABLE";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_ARGUMENT";
		break;
	case TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE:
		result = "TEST_CASE_SUBROUTINE_USED_AS_CONSTRUCTOR_RETURN_TYPE";
		break;
	default:
		break;
	}

	return result;
}